

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O3

void __thiscall CVmObjFrameRef::create_loadctx_obj(CVmObjFrameRef *this,vm_val_t *result)

{
  long *plVar1;
  long lVar2;
  vm_obj_id_t targobj;
  vm_obj_id_t defobj;
  vm_obj_id_t self;
  vm_prop_id_t targprop;
  vm_prop_id_t *pvVar3;
  
  plVar1 = (long *)(this->super_CVmObject).ext_;
  lVar2 = *plVar1;
  if (lVar2 == 0) {
    self = 0;
    if ((int)plVar1[5] == 5) {
      self = *(vm_obj_id_t *)(plVar1 + 6);
    }
    defobj = *(vm_obj_id_t *)(plVar1 + 7);
    targobj = *(vm_obj_id_t *)((long)plVar1 + 0x3c);
    pvVar3 = (vm_prop_id_t *)(plVar1 + 8);
  }
  else {
    defobj = 0;
    self = 0;
    if (*(int *)(lVar2 + -0x80) != 1) {
      self = *(vm_obj_id_t *)(lVar2 + -0x78);
    }
    if (*(int *)(lVar2 + -0x90) == 5) {
      defobj = *(vm_obj_id_t *)(lVar2 + -0x88);
    }
    targobj = 0;
    if (*(int *)(lVar2 + -0xa0) != 1) {
      targobj = *(vm_obj_id_t *)(lVar2 + -0x98);
    }
    if (*(int *)(lVar2 + -0xb0) == 1) {
      targprop = 0;
      goto LAB_002905a5;
    }
    pvVar3 = (vm_prop_id_t *)(lVar2 + -0xa8);
  }
  targprop = *pvVar3;
LAB_002905a5:
  CVmRun::create_loadctx_obj(result,self,defobj,targobj,targprop);
  return;
}

Assistant:

void CVmObjFrameRef::create_loadctx_obj(VMG_ vm_val_t *result)
{
    vm_frameref_ext *ext = get_ext();
    vm_val_t *fp = ext->fp;
    vm_obj_id_t self, defobj, targobj;
    vm_prop_id_t targprop;

    /* retrieve the method context elements */
    if (fp != 0)
    {
        /* get the context elements from the live stack frame */
        self = G_interpreter->get_self_from_frame(vmg_ fp);
        defobj = G_interpreter->get_defining_obj_from_frame(vmg_ fp);
        targobj = G_interpreter->get_orig_target_obj_from_frame(vmg_ fp);
        targprop = G_interpreter->get_target_prop_from_frame(vmg_ fp);
    }
    else
    {
        /* the stack frame has exited, so use our snapshot */
        self = (ext->self.typ == VM_OBJ ? ext->self.val.obj : VM_INVALID_OBJ);
        defobj = ext->defobj;
        targobj = ext->targobj;
        targprop = ext->targprop;
    }

    /* create the context object */
    CVmRun::create_loadctx_obj(vmg_ result, self, defobj, targobj, targprop);
}